

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

string_t duckdb::DecimalToString::Format<long>
                   (long value,uint8_t width,uint8_t scale,Vector *vector)

{
  int val;
  Vector *vector_00;
  char *dst;
  idx_t len;
  string_t result;
  anon_union_16_2_67f50693_for_value local_38;
  
  val = DecimalLength<long>(value,width,scale);
  vector_00 = (Vector *)NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  local_38.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)vector,vector_00,len);
  dst = local_38.pointer.prefix;
  if (0xc < local_38._0_4_) {
    dst = local_38._8_8_;
  }
  FormatDecimal<long>(value,width,scale,dst,(long)val);
  string_t::Finalize((string_t *)&local_38.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38.pointer;
}

Assistant:

static string_t Format(SIGNED value, uint8_t width, uint8_t scale, Vector &vector) {
		int len = DecimalLength<SIGNED>(value, width, scale);
		string_t result = StringVector::EmptyString(vector, NumericCast<size_t>(len));
		FormatDecimal<SIGNED>(value, width, scale, result.GetDataWriteable(), UnsafeNumericCast<idx_t>(len));
		result.Finalize();
		return result;
	}